

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

void __thiscall
MovParsedH264TrackData::extractData
          (MovParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  uchar *__src;
  size_type sVar4;
  void *pvVar5;
  uint32_t nalSize;
  uint8_t *end;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range2;
  uint8_t *dst;
  uint8_t *puStack_20;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  MovParsedH264TrackData *this_local;
  
  __range2 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)pkt->data;
  bVar2 = std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::empty(&this->spsPpsList);
  if (!bVar2) {
    __end2 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::begin(&this->spsPpsList);
    i = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::end(&this->spsPpsList);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  *)&i);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::operator*(&__end2);
      *(undefined1 *)
       &(__range2->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = 0;
      *(undefined1 *)
       ((long)&(__range2->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1) = 0;
      *(undefined1 *)
       ((long)&(__range2->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2) = 0;
      pvVar5 = (void *)((long)&(__range2->
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 4);
      *(undefined1 *)
       ((long)&(__range2->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3) = 1;
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      memcpy(pvVar5,__src,sVar4);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      __range2 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(sVar4 + (long)pvVar5);
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::clear(&this->spsPpsList);
  }
  for (puStack_20 = buff; puStack_20 < buff + size;
      puStack_20 = puStack_20 + (int)(uint)bVar1 + uVar3) {
    uVar3 = getNalSize(this,puStack_20);
    bVar1 = this->nal_length_size;
    *(undefined1 *)
     &(__range2->
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined1 *)
     ((long)&(__range2->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1) = 0;
    *(undefined1 *)
     ((long)&(__range2->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2) = 0;
    pvVar5 = (void *)((long)&(__range2->
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4);
    *(undefined1 *)
     ((long)&(__range2->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3) = 1;
    memcpy(pvVar5,puStack_20 + (int)(uint)bVar1,(ulong)uVar3);
    __range2 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)((long)pvVar5 + (ulong)uVar3);
  }
  return;
}

Assistant:

void extractData(AVPacket* pkt, uint8_t* buff, const int size) override
    {
        uint8_t* dst = pkt->data;
        if (!spsPpsList.empty())
        {
            for (auto& i : spsPpsList)
            {
                *dst++ = 0x0;
                *dst++ = 0x0;
                *dst++ = 0x0;
                *dst++ = 0x1;

                memcpy(dst, i.data(), i.size());
                dst += i.size();
            }
            spsPpsList.clear();
        }
        const uint8_t* end = buff + size;
        while (buff < end)
        {
            const uint32_t nalSize = getNalSize(buff);
            buff += nal_length_size;
            *dst++ = 0x00;
            *dst++ = 0x00;
            *dst++ = 0x00;
            *dst++ = 0x01;
            memcpy(dst, buff, nalSize);
            dst += nalSize;
            buff += nalSize;
        }
    }